

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O1

void __thiscall ixxx::ansi::env::test_method(env *this)

{
  char *__s;
  undefined1 local_f2;
  undefined1 local_f1;
  string s;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  undefined1 **local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 local_a0;
  undefined8 local_98;
  shared_count sStack_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  undefined **local_58;
  undefined1 local_50;
  undefined8 *local_48;
  char *local_40;
  undefined **local_38;
  undefined1 local_30;
  undefined8 *local_28;
  undefined1 **local_20;
  
  __s = getenv("PATH");
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,__s,(allocator<char> *)&local_d0);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x71);
  local_50 = 0;
  local_58 = &PTR__lazy_ostream_001247e8;
  local_48 = &boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_f1 = s._M_string_length == 0;
  local_a8 = &local_f1;
  local_b0 = &local_f2;
  local_a0 = !(bool)local_f1;
  local_f2 = 0;
  local_98 = 0;
  sStack_90.pi_ = (sp_counted_base *)0x0;
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_60 = "";
  local_b8 = &local_a8;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00124860;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_20 = &local_b0;
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_00124860;
  local_28 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( env )
    {
      string s(ansi::getenv("PATH"));
      BOOST_CHECK_EQUAL(s.empty(), false);
    }